

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

dtime_t __thiscall duckdb::StrpTimeFormat::ParseResult::ToTime(ParseResult *this)

{
  short sVar1;
  dtime_t dVar2;
  
  sVar1 = (short)((long)this->data[7] % 0xe10);
  dVar2 = Time::FromTime(this->data[7] / -0xe10 + this->data[3],this->data[4] - (int)(sVar1 / 0x3c),
                         this->data[5] - (int)(sVar1 % 0x3c),
                         (int32_t)(((long)this->data[6] + 500) / 1000));
  return (dtime_t)dVar2.micros;
}

Assistant:

dtime_t StrpTimeFormat::ParseResult::ToTime() {
	int hh, mm, ss;
	StrfTimeSplitOffset(data[7], hh, mm, ss);
	return Time::FromTime(data[3] - hh, data[4] - mm, data[5] - ss, GetMicros());
}